

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhereState.hpp
# Opt level: O3

void __thiscall
linq::
WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/main.cpp:31:13),_int>
::Init(WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_main_cpp:31:13),_int>
       *this)

{
  int iVar1;
  uint uVar2;
  
  (**((this->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
     ->_vptr_IState)();
  while( true ) {
    iVar1 = (*((this->source).state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    if ((char)iVar1 == '\0') {
      return;
    }
    uVar2 = (*((this->source).state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[3])();
    if ((uVar2 & 1) == 0) break;
    (*((this->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      )->_vptr_IState[2])();
  }
  return;
}

Assistant:

void Init() final override 
			{ 
				source.Init(); 
				
				while(source.Valid() && !filter(source.Current()))
					source.Advance();
			}